

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::MergeScenes
               (aiScene **_dest,vector<aiScene_*,_std::allocator<aiScene_*>_> *src,uint flags)

{
  aiScene *paVar1;
  aiNode *paVar2;
  uint uVar3;
  ulong uVar4;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> srcList;
  allocator_type local_41;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> local_40;
  
  if (_dest != (aiScene **)0x0) {
    paVar1 = *_dest;
    if (*(undefined8 **)src == *(undefined8 **)(src + 8)) {
      if (paVar1 != (aiScene *)0x0) {
        aiScene::~aiScene(paVar1);
        CopySceneFlat(_dest,(aiScene *)**(undefined8 **)src);
        return;
      }
      *_dest = (aiScene *)**(undefined8 **)src;
    }
    else {
      if (paVar1 == (aiScene *)0x0) {
        paVar1 = (aiScene *)operator_new(0x80);
        aiScene::aiScene(paVar1);
        *_dest = paVar1;
      }
      else {
        aiScene::~aiScene(paVar1);
      }
      paVar1 = (aiScene *)operator_new(0x80);
      aiScene::aiScene(paVar1);
      paVar2 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar2);
      paVar1->mRootNode = paVar2;
      (paVar2->mName).length = 0xb;
      builtin_strncpy((paVar2->mName).data,"<MergeRoot>",0xc);
      std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::vector
                (&local_40,*(long *)(src + 8) - *(long *)src >> 3,&local_41);
      if (local_40.
          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_40.
          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar3 = 1;
        uVar4 = 0;
        do {
          paVar2 = paVar1->mRootNode;
          local_40.
          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar4].scene =
               *(aiScene **)(*(long *)src + uVar4 * 8);
          local_40.
          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar4].attachToNode = paVar2;
          uVar4 = (ulong)uVar3;
          uVar3 = uVar3 + 1;
        } while (uVar4 < (ulong)((long)local_40.
                                       super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_40.
                                       super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      MergeScenes(_dest,paVar1,&local_40,flags);
      if (local_40.
          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_40.
                        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_40.
                              super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.
                              super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void SceneCombiner::MergeScenes(aiScene** _dest,std::vector<aiScene*>& src, unsigned int flags) {
    if ( nullptr == _dest ) {
        return;
    }

    // if _dest points to NULL allocate a new scene. Otherwise clear the old and reuse it
    if (src.empty()) {
        if (*_dest) {
            (*_dest)->~aiScene();
            SceneCombiner::CopySceneFlat(_dest,src[0]);
        }
        else *_dest = src[0];
        return;
    }
    if (*_dest)(*_dest)->~aiScene();
    else *_dest = new aiScene();

    // Create a dummy scene to serve as master for the others
    aiScene* master = new aiScene();
    master->mRootNode = new aiNode();
    master->mRootNode->mName.Set("<MergeRoot>");

    std::vector<AttachmentInfo> srcList (src.size());
    for (unsigned int i = 0; i < srcList.size();++i)    {
        srcList[i] = AttachmentInfo(src[i],master->mRootNode);
    }

    // 'master' will be deleted afterwards
    MergeScenes (_dest, master, srcList, flags);
}